

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevolute::Initialize
          (ChLinkRevolute *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2,
          ChFrame<double> *frame)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ChBodyFrame *pCVar4;
  ChBodyFrame *pCVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 local_68 [56];
  double local_30;
  double local_28;
  
  peVar1 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar5 = &peVar1->super_ChBodyFrame;
  if (peVar1 == (element_type *)0x0) {
    pCVar5 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar5;
  peVar1 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar4 = &peVar1->super_ChBodyFrame;
  if (peVar1 == (element_type *)0x0) {
    pCVar4 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar4;
  iVar2 = (*(pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_x,(ChVariables *)CONCAT44(extraout_var,iVar2),
             (ChVariables *)CONCAT44(extraout_var_00,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_y,(ChVariables *)CONCAT44(extraout_var_01,iVar2),
             (ChVariables *)CONCAT44(extraout_var_02,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_z,(ChVariables *)CONCAT44(extraout_var_03,iVar2),
             (ChVariables *)CONCAT44(extraout_var_04,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_uw,(ChVariables *)CONCAT44(extraout_var_05,iVar2),
             (ChVariables *)CONCAT44(extraout_var_06,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_vw,(ChVariables *)CONCAT44(extraout_var_07,iVar2),
             (ChVariables *)CONCAT44(extraout_var_08,iVar3));
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLink).Body1,frame,&this->m_frame1);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLink).Body2,frame,&this->m_frame2);
  local_68._24_8_ =
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_30 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_30;
  local_68._16_8_ =
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_68._16_8_;
  local_68._0_8_ = 0.0;
  auVar12._0_8_ = -(double)local_68._24_8_;
  auVar12._8_4_ = 0;
  auVar12._12_4_ = 0x80000000;
  local_68._8_8_ = vmovlps_avx(auVar12);
  auVar6 = vmovlhps_avx(auVar6,auVar9);
  local_68._32_8_ = 0.0;
  local_68._40_8_ = auVar6._0_8_ ^ 0x8000000000000000;
  local_68._48_4_ = auVar6._8_4_;
  local_68._52_4_ = auVar6._12_4_ ^ 0x80000000;
  local_28 = 0.0;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            (&(this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>,
             (Matrix<double,_3,_3,_1,_3,_3> *)local_68);
  local_68._24_8_ =
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_30 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_30;
  local_68._16_8_ =
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_68._16_8_;
  local_68._0_8_ = 0.0;
  auVar13._0_8_ = -(double)local_68._24_8_;
  auVar13._8_4_ = 0;
  auVar13._12_4_ = 0x80000000;
  local_68._8_8_ = vmovlps_avx(auVar13);
  auVar6 = vmovlhps_avx(auVar7,auVar10);
  local_68._32_8_ = 0.0;
  local_68._40_8_ = auVar6._0_8_ ^ 0x8000000000000000;
  local_68._48_4_ = auVar6._8_4_;
  local_68._52_4_ = auVar6._12_4_ ^ 0x80000000;
  local_28 = 0.0;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            (&(this->m_v1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>,
             (Matrix<double,_3,_3,_1,_3,_3> *)local_68);
  local_68._24_8_ =
       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_30 = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_30;
  local_68._16_8_ =
       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_68._16_8_;
  local_68._0_8_ = 0.0;
  auVar14._0_8_ = -(double)local_68._24_8_;
  auVar14._8_4_ = 0;
  auVar14._12_4_ = 0x80000000;
  local_68._8_8_ = vmovlps_avx(auVar14);
  auVar6 = vmovlhps_avx(auVar8,auVar11);
  local_68._32_8_ = 0.0;
  local_68._40_8_ = auVar6._0_8_ ^ 0x8000000000000000;
  local_68._48_4_ = auVar6._8_4_;
  local_68._52_4_ = auVar6._12_4_ ^ 0x80000000;
  local_28 = 0.0;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            (&(this->m_w2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>,
             (Matrix<double,_3,_3,_1,_3,_3> *)local_68);
  Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&this->m_C);
  return;
}

Assistant:

void ChLinkRevolute::Initialize(std::shared_ptr<ChBody> body1,
                                std::shared_ptr<ChBody> body2,
                                const ChFrame<>& frame) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_x.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_y.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_z.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_uw.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_vw.SetVariables(&Body1->Variables(), &Body2->Variables());

    ((ChFrame<>*)Body1)->TransformParentToLocal(frame, m_frame1);
    ((ChFrame<>*)Body2)->TransformParentToLocal(frame, m_frame2);

    m_u1_tilde = ChStarMatrix33<>(m_frame1.GetA().Get_A_Xaxis());
    m_v1_tilde = ChStarMatrix33<>(m_frame1.GetA().Get_A_Yaxis());
    m_w2_tilde = ChStarMatrix33<>(m_frame2.GetA().Get_A_Zaxis());

    m_C.setZero();
}